

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

base_learner * ExpReplay::expreplay_setup<(char)98,simple_label>(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  pointer peVar3;
  example *peVar4;
  bool *pbVar5;
  ostream *poVar6;
  base_learner *f;
  single_learner *dat;
  learner<ExpReplay::expreplay,_example> *base;
  vw *in_RSI;
  long *in_RDI;
  learner<ExpReplay::expreplay,_example> *l;
  option_group_definition new_options;
  free_ptr<ExpReplay::expreplay> er;
  string replay_count_string;
  string replay_string;
  typed_option<unsigned_long> *in_stack_fffffffffffffb38;
  vw *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  typed_option<unsigned_long> *in_stack_fffffffffffffb50;
  learner<ExpReplay::expreplay,_example> *in_stack_fffffffffffffb60;
  typed_option<unsigned_long> *in_stack_fffffffffffffb88;
  option_group_definition *in_stack_fffffffffffffb90;
  allocator local_3e9;
  string local_3e8 [32];
  string local_3c8 [200];
  learner<char,_char> *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  allocator local_261;
  string local_260 [32];
  string local_240 [32];
  typed_option<unsigned_long> local_220 [2];
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [56];
  undefined1 local_80 [71];
  allocator local_39;
  string local_38 [32];
  vw *local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  local_18 = in_RSI;
  local_10._M_allocated_capacity = (size_type)in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"replay_",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,'b');
  std::__cxx11::string::string((string *)(local_80 + 0x10),local_38);
  std::__cxx11::string::operator+=((string *)(local_80 + 0x10),"_count");
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Experience Replay",&local_d9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::string(local_240,local_38);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x140dff);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffb48,(unsigned_long *)in_stack_fffffffffffffb40);
  VW::config::typed_option<unsigned_long>::keep(local_220,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_261);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::__cxx11::string::string(local_3c8,(string *)(local_80 + 0x10));
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x140ee5);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffb48,(unsigned_long *)in_stack_fffffffffffffb40);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffb50,(unsigned_long)in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3e8,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_3e9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40,
             (string *)in_stack_fffffffffffffb38);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_3c8);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_240);
  (*(code *)**(undefined8 **)local_10._M_allocated_capacity)
            (local_10._M_allocated_capacity,local_b8);
  bVar2 = (**(code **)(*(long *)local_10._M_allocated_capacity + 8))
                    (local_10._M_allocated_capacity,local_38);
  if (((bVar2 & 1) == 0) ||
     (peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141077),
     pvVar1 = local_18, peVar3->N == 0)) {
    local_10._8_8_ = (base_learner *)0x0;
  }
  else {
    peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1412ea);
    peVar3->all = pvVar1;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1412fc);
    peVar4 = VW::alloc_examples((size_t)in_stack_fffffffffffffb48,(size_t)in_stack_fffffffffffffb40)
    ;
    peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141323);
    peVar3->buf = peVar4;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141336);
    pbVar5 = calloc_or_throw<bool>(in_stack_fffffffffffffd08);
    peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141353);
    peVar3->filled = pbVar5;
    if ((local_18->quiet & 1U) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar6 = std::operator<<(poVar6,'b');
      poVar6 = std::operator<<(poVar6,", buffer=");
      peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1413c6);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,peVar3->N);
      poVar6 = std::operator<<(poVar6,", replay count=");
      peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141400);
      in_stack_fffffffffffffb60 =
           (learner<ExpReplay::expreplay,_example> *)
           std::ostream::operator<<(poVar6,peVar3->replay_count);
      std::ostream::operator<<(in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>);
    }
    f = setup_base((options_i *)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    dat = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffd00);
    in_stack_fffffffffffffb40 = (vw *)local_80;
    peVar3 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x141469);
    peVar3->base = dat;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x14147c);
    base = LEARNER::init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                     ((free_ptr<ExpReplay::expreplay> *)dat,
                      (learner<char,_example> *)in_stack_fffffffffffffb48,
                      (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffb40,
                      (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffb38);
    LEARNER::learner<ExpReplay::expreplay,_example>::set_finish
              (in_stack_fffffffffffffb60,(_func_void_expreplay_ptr *)f);
    LEARNER::learner<ExpReplay::expreplay,_example>::set_end_pass
              (in_stack_fffffffffffffb60,(_func_void_expreplay_ptr *)f);
    local_10._8_8_ = LEARNER::make_base<ExpReplay::expreplay,example>(base);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb40);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)in_stack_fffffffffffffb40);
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  std::__cxx11::string::~string(local_38);
  return (base_learner *)local_10._8_8_;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}